

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall
embree::TutorialApplication::compareToReferenceImage(TutorialApplication *this,FileName *fileName)

{
  uint uVar1;
  Col4<unsigned_char> *color;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  runtime_error *this_01;
  uint uVar2;
  TutorialApplication *this_02;
  double dVar3;
  Ref<embree::Image> reference;
  ISPCCamera ispccamera;
  Ref<embree::Image> local_c0;
  Ref<embree::Image> local_b8;
  Image *local_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  
  resize(this,this->width,this->height);
  this_02 = (TutorialApplication *)&stack0xffffffffffffff9c;
  Camera::getISPCCamera((ISPCCamera *)this_02,&this->camera,(ulong)this->width,(ulong)this->height);
  initRayStats(this_02);
  if (this->numFrames != 0) {
    uVar2 = 0;
    do {
      (*(this->super_Application)._vptr_Application[0xb])
                ((ulong)(uint)this->render_time,this,this->pixels,(ulong)this->width,
                 (ulong)this->height,&stack0xffffffffffffff9c);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->numFrames);
  }
  this_00 = (ImageT<embree::Col4<unsigned_char>_> *)operator_new(0x48);
  uVar2 = this->width;
  uVar1 = this->height;
  color = (Col4<unsigned_char> *)this->pixels;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  ImageT<embree::Col4<unsigned_char>_>::ImageT
            (this_00,(ulong)uVar2,(ulong)uVar1,color,true,&local_a8,false);
  (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  loadImage((embree *)&local_b0,fileName,false);
  local_b8.ptr = (Image *)this_00;
  (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
  local_c0.ptr = local_b0;
  if (local_b0 != (Image *)0x0) {
    (*(local_b0->super_RefCount)._vptr_RefCount[2])();
  }
  dVar3 = compareImages(&local_b8,&local_c0);
  if (local_c0.ptr != (Image *)0x0) {
    (*((local_c0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((ImageT<embree::Col4<unsigned_char>_> *)local_b8.ptr !=
      (ImageT<embree::Col4<unsigned_char>_> *)0x0) {
    (*(((Image *)&(local_b8.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  if (dVar3 <= (double)this->referenceImageThreshold) {
    if (local_b0 != (Image *)0x0) {
      (*(local_b0->super_RefCount)._vptr_RefCount[3])();
    }
    (*(this_00->super_Image).super_RefCount._vptr_RefCount[3])(this_00);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_88,vsnprintf,0x148,"%f",dVar3);
  std::operator+(&local_a8,"reference image differs by ",&local_88);
  std::runtime_error::runtime_error(this_01,(string *)&local_a8);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TutorialApplication::compareToReferenceImage(const FileName& fileName)
  {
    resize(width,height);
    ISPCCamera ispccamera = camera.getISPCCamera(width,height);
    initRayStats();
    
    for (unsigned int i=0; i<numFrames; i++)
      render(pixels,width,height,render_time,ispccamera);

    Ref<Image> image = new Image4uc(width, height, (Col4uc*)pixels);
    Ref<Image> reference = loadImage(fileName);
    const double error = compareImages(image,reference);
    if (error > referenceImageThreshold) // error corresponds roughly to number of pixels that are completely off in color
      throw std::runtime_error("reference image differs by " + std::to_string(error));
  }